

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O2

uint __thiscall ON_SubDFaceEdgeIterator::Initialize(ON_SubDFaceEdgeIterator *this,ON_SubDFace *face)

{
  uint uVar1;
  
  this->m_face = face;
  if (face == (ON_SubDFace *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = (uint)face->m_edge_count;
  }
  this->m_edge_count = uVar1;
  this->m_edge_index0 = 0;
  this->m_edge_index = 0;
  return uVar1;
}

Assistant:

unsigned int ON_SubDFaceEdgeIterator::Initialize(
  const ON_SubDFace* face,
  const ON_SubDEdge* first_edge
  )
{
  m_face = face;
  m_edge_count = (nullptr != face) ? face->m_edge_count : 0;
  if (m_edge_count > 0 && nullptr != first_edge)
  {
    m_edge_index0 = face->EdgeArrayIndex(first_edge);
    if (ON_UNSET_UINT_INDEX == m_edge_index0)
    {
      m_edge_count = 0;
      m_edge_index0 = 0;
    }
  }
  else
  {
    m_edge_index0 = 0;
  }
  m_edge_index = m_edge_index0;
  return m_edge_count;
}